

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PBool::PBool(PBool *this)

{
  bool local_49;
  FName local_1c;
  DObject *local_18;
  PSymbolConstNumeric *maxsym;
  PBool *this_local;
  
  maxsym = (PSymbolConstNumeric *)this;
  PInt::PInt(&this->super_PInt,1,true);
  *(undefined ***)&this->super_PInt = &PTR_StaticType_00b6a408;
  FName::FName(&local_1c,NAME_Max);
  local_18 = &PSymbolTable::FindSymbol
                        ((PSymbolTable *)&(this->super_PInt).field_0x38,&local_1c,false)->
              super_DObject;
  local_49 = false;
  if (local_18 != (DObject *)0x0) {
    local_49 = DObject::IsKindOf(local_18,PSymbolConstNumeric::RegistrationInfo.MyClass);
  }
  if (local_49 == false) {
    __assert_fail("maxsym != NULL && maxsym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0x46a,"PBool::PBool()");
  }
  *(undefined4 *)&local_18[1].Class = 1;
  return;
}

Assistant:

PBool::PBool()
: PInt(sizeof(bool), true)
{
	// Override the default max set by PInt's constructor
	PSymbolConstNumeric *maxsym = static_cast<PSymbolConstNumeric *>(Symbols.FindSymbol(NAME_Max, false));
	assert(maxsym != NULL && maxsym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric)));
	maxsym->Value = 1;
}